

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerMSL::add_meshlet_block(CompilerMSL *this,bool per_primitive)

{
  ParsedIR *this_00;
  uint id;
  ID id_00;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  SPIRVariable **ppSVar3;
  bool bVar4;
  SPIRVariable *pSVar5;
  SPIRType *ib_type;
  undefined7 in_register_00000031;
  long lVar6;
  uint32_t uVar7;
  long lVar8;
  allocator local_219;
  uint32_t local_218;
  undefined4 local_214;
  CompilerMSL *local_210;
  string local_208;
  SmallVector<spirv_cross::SPIRVariable_*,_8UL> vars;
  InterfaceBlockMeta meta;
  
  local_214 = (undefined4)CONCAT71(in_register_00000031,per_primitive);
  vars.super_VectorView<spirv_cross::SPIRVariable_*>.ptr = (SPIRVariable **)&vars.stack_storage;
  vars.super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = 0;
  vars.buffer_capacity = 8;
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar6 = 0; sVar2 << 2 != lVar6; lVar6 = lVar6 + 4) {
    id = *(uint *)((long)&pTVar1->id + lVar6);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id].type == TypeVariable) {
      pSVar5 = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,id);
      if ((pSVar5->storage == StorageClassOutput) &&
         ((pSVar5->super_IVariant).self.id != this->builtin_mesh_primitive_indices_id)) {
        bVar4 = CompilerGLSL::is_per_primitive_variable(&this->super_CompilerGLSL,pSVar5);
        if (bVar4 == (bool)(char)local_214) {
          meta.location_meta._M_h._M_buckets = (__buckets_ptr)pSVar5;
          SmallVector<spirv_cross::SPIRVariable_*,_8UL>::push_back(&vars,(SPIRVariable **)&meta);
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_208);
  if (vars.super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size == 0) {
    uVar7 = 0;
  }
  else {
    local_218 = ParsedIR::increase_bound_by(this_00,1);
    meta.location_meta._M_h._M_rehash_policy._0_8_ = &meta.strip_array;
    meta.location_meta._M_h._M_buckets = (__buckets_ptr)&PTR__SPIRType_00354178;
    meta.location_meta._M_h._M_bucket_count = 0x1e00000000;
    meta.location_meta._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    meta.location_meta._M_h._M_element_count = 0x100000001;
    meta.location_meta._M_h._M_rehash_policy._M_next_resize = 0;
    meta.location_meta._M_h._M_single_bucket = (__node_base_ptr)0x8;
    local_210 = this;
    ib_type = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType>
                        ((Compiler *)this,local_218,(SPIRType *)&meta);
    SPIRType::~SPIRType((SPIRType *)&meta);
    ppSVar3 = vars.super_VectorView<spirv_cross::SPIRVariable_*>.ptr;
    ib_type->basetype = Struct;
    meta.location_meta._M_h._M_buckets = &meta.location_meta._M_h._M_single_bucket;
    meta.location_meta._M_h._M_bucket_count = 1;
    meta.location_meta._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    meta.location_meta._M_h._M_element_count = 0;
    meta.location_meta._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    meta.location_meta._M_h._M_rehash_policy._M_next_resize = 0;
    meta.location_meta._M_h._M_single_bucket = (__node_base_ptr)0x0;
    meta.strip_array = false;
    meta.allow_local_declaration = false;
    lVar6 = vars.super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size << 3;
    for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 8) {
      pSVar5 = *(SPIRVariable **)((long)ppSVar3 + lVar8);
      meta.strip_array = true;
      meta.allow_local_declaration = false;
      ::std::__cxx11::string::string((string *)&local_208,"",&local_219);
      add_variable_to_interface_block(local_210,StorageClassOutput,&local_208,ib_type,pSVar5,&meta);
      ::std::__cxx11::string::~string((string *)&local_208);
    }
    id_00.id = (ib_type->super_IVariant).self.id;
    if ((char)local_214 == '\0') {
      ::std::__cxx11::string::string((string *)&local_208,"spvPerVertex",&local_219);
      uVar7 = local_218;
      Compiler::set_name((Compiler *)local_210,id_00,&local_208);
    }
    else {
      ::std::__cxx11::string::string((string *)&local_208,"spvPerPrimitive",&local_219);
      uVar7 = local_218;
      Compiler::set_name((Compiler *)local_210,id_00,&local_208);
    }
    ::std::__cxx11::string::~string((string *)&local_208);
    ::std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&meta);
  }
  SmallVector<spirv_cross::SPIRVariable_*,_8UL>::~SmallVector(&vars);
  return uVar7;
}

Assistant:

uint32_t CompilerMSL::add_meshlet_block(bool per_primitive)
{
	// Accumulate the variables that should appear in the interface struct.
	SmallVector<SPIRVariable *> vars;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (var.storage != StorageClassOutput || var.self == builtin_mesh_primitive_indices_id)
			return;
		if (is_per_primitive_variable(var) != per_primitive)
			return;
		vars.push_back(&var);
	});

	if (vars.empty())
		return 0;

	uint32_t next_id = ir.increase_bound_by(1);
	auto &type = set<SPIRType>(next_id, SPIRType(OpTypeStruct));
	type.basetype = SPIRType::Struct;

	InterfaceBlockMeta meta;
	for (auto *p_var : vars)
	{
		meta.strip_array = true;
		meta.allow_local_declaration = false;
		add_variable_to_interface_block(StorageClassOutput, "", type, *p_var, meta);
	}

	if (per_primitive)
		set_name(type.self, "spvPerPrimitive");
	else
		set_name(type.self, "spvPerVertex");

	return next_id;
}